

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_addiusp(DisasContext_conflict6 *ctx)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ctx->opcode >> 1;
  uVar2 = uVar1 & 0x1ff;
  if (uVar2 < 2) {
    uVar2 = uVar2 | 0x100;
  }
  else if (0xff < uVar2) {
    if (uVar2 < 0x1fe) {
      uVar2 = uVar1 | 0xfffffe00;
    }
    else {
      uVar2 = uVar2 - 0x300;
    }
  }
  gen_arith_imm(ctx,0x24000000,0x1d,0x1d,uVar2 << 2);
  return;
}

Assistant:

static void gen_addiusp(DisasContext *ctx)
{
    int encoded = ZIMM(ctx->opcode, 1, 9);
    int decoded;

    if (encoded <= 1) {
        decoded = 256 + encoded;
    } else if (encoded <= 255) {
        decoded = encoded;
    } else if (encoded <= 509) {
        decoded = encoded - 512;
    } else {
        decoded = encoded - 768;
    }

    gen_arith_imm(ctx, OPC_ADDIU, 29, 29, decoded << 2);
}